

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O3

bool __thiscall ui::anon_unknown_0::WiFiImpl::WifiStatus(WiFiImpl *this)

{
  int iVar1;
  bool bVar2;
  ifreq req;
  byte local_28;
  
  bVar2 = false;
  iVar1 = socket(2,2,0);
  if (-1 < iVar1) {
    iVar1 = ioctl(iVar1,0x8913);
    if (iVar1 == 0) {
      bVar2 = (bool)(local_28 & 1);
    }
    else {
      perror("SIOCGIFFLAGS");
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool WifiStatus() {
    int skfd = socket(AF_INET, SOCK_DGRAM, 0);

    if (skfd < 0) {
      return 0;
    }

    const char* ifname = "wlan0";
    struct ifreq req;

    strncpy(req.ifr_ifrn.ifrn_name, ifname, IFNAMSIZ);

    int err = ioctl(skfd, SIOCGIFFLAGS, &req);
    if (err) {
      perror("SIOCGIFFLAGS");
      return err;
    } else {
      int flags = req.ifr_ifru.ifru_flags;
      return (flags & IFF_UP) ? true : false;
    }
    return 0;
  }